

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.h
# Opt level: O2

bool __thiscall ByteCodeGenerator::HasInterleavingDynamicScope(ByteCodeGenerator *this,Symbol *sym)

{
  Scope *symScope;
  FuncInfo *funcInfo;
  Scope *pSVar1;
  PropertyId local_1c [2];
  PropertyId unused;
  
  if (this->dynamicScopeCount != 0) {
    symScope = sym->scope;
    funcInfo = TopFuncInfo(this);
    pSVar1 = FindScopeForSym(this,symScope,(Scope *)0x0,local_1c,funcInfo);
    return symScope != pSVar1;
  }
  return false;
}

Assistant:

bool InDynamicScope() const { return dynamicScopeCount != 0; }